

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O3

FT_Error af_latin_hints_detect_features
                   (AF_GlyphHints hints,FT_UInt width_count,AF_WidthRec *widths,AF_Dimension dim)

{
  AF_Edge *ppAVar1;
  AF_Edge *ppAVar2;
  FT_Bool top_to_bottom_hinting;
  char cVar3;
  byte bVar4;
  AF_StyleMetrics_conflict pAVar5;
  FT_Memory memory;
  AF_ScriptClass pAVar6;
  FT_Long b_;
  AF_Segment pAVar7;
  AF_Edge *ppAVar8;
  short sVar9;
  FT_Error FVar10;
  FT_Long FVar11;
  long lVar12;
  FT_Long FVar13;
  long lVar14;
  AF_Edge_conflict pAVar15;
  FT_Long FVar16;
  ulong uVar17;
  AF_Edge_conflict pAVar18;
  ulong uVar19;
  AF_Edge_conflict pAVar20;
  uint uVar21;
  AF_Segment_conflict pAVar22;
  AF_Segment pAVar23;
  int iVar24;
  long lVar25;
  int iVar26;
  long lVar27;
  uint uVar28;
  uint uVar29;
  AF_Segment_conflict pAVar30;
  AF_Segment_conflict pAVar31;
  AF_Segment *ppAVar32;
  bool bVar33;
  AF_Edge_conflict local_38;
  
  FVar10 = af_latin_hints_compute_segments(hints,dim);
  if (FVar10 != 0) {
    return FVar10;
  }
  af_latin_hints_link_segments(hints,width_count,widths,dim);
  uVar19 = (ulong)dim;
  pAVar5 = hints->metrics;
  pAVar22 = hints->axis[uVar19].segments;
  if (pAVar22 == (AF_Segment_conflict)0x0) {
    pAVar30 = (AF_Segment_conflict)0x0;
  }
  else {
    pAVar30 = pAVar22 + hints->axis[uVar19].num_segments;
  }
  memory = hints->memory;
  pAVar6 = af_script_classes[pAVar5->style_class->script];
  hints->axis[uVar19].num_edges = 0;
  b_ = *(FT_Long *)
        ((long)hints->axis[0].embedded.segments + (ulong)(dim != AF_DIMENSION_HORZ) * 0x10 + -0x68);
  if (dim == AF_DIMENSION_VERT) {
    top_to_bottom_hinting = pAVar6->top_to_bottom_hinting;
  }
  else {
    if (dim == AF_DIMENSION_HORZ) {
      FVar16 = FT_DivFix(0x40,hints->y_scale);
      top_to_bottom_hinting = '\0';
      goto LAB_0026a7ba;
    }
    top_to_bottom_hinting = '\0';
  }
  FVar16 = 0;
LAB_0026a7ba:
  FVar11 = FT_DivFix(0x20,b_);
  lVar12 = (long)*(int *)((long)pAVar5 + uVar19 * 0x4c90 + 0x1e8) * (long)(int)b_;
  iVar26 = (int)((ulong)(lVar12 + (lVar12 >> 0x3f) + 0x8000) >> 0x10);
  iVar24 = 0x10;
  if (iVar26 < 0x10) {
    iVar24 = iVar26;
  }
  FVar13 = FT_DivFix((long)iVar24,b_);
  if (pAVar22 < pAVar30) {
    lVar12 = FVar16 * 3;
    pAVar31 = pAVar22;
    do {
      lVar14 = (long)pAVar31->height;
      if ((FVar16 <= lVar14) && (pAVar31->delta <= FVar11)) {
        cVar3 = pAVar31->dir;
        if ((cVar3 != AF_DIR_NONE) &&
           ((pAVar31->serif == (AF_Segment)0x0 ||
            (lVar12 == lVar14 * 2 || SBORROW8(lVar12,lVar14 * 2) != lVar12 + lVar14 * -2 < 0)))) {
          uVar17 = (ulong)hints->axis[uVar19].num_edges;
          if (uVar17 == 0) {
            sVar9 = pAVar31->pos;
          }
          else {
            pAVar18 = hints->axis[uVar19].edges;
            sVar9 = pAVar31->pos;
            lVar14 = 0;
            do {
              lVar27 = (long)sVar9 - (long)*(short *)((long)&pAVar18->fpos + lVar14);
              lVar25 = -lVar27;
              if (0 < lVar27) {
                lVar25 = lVar27;
              }
              if ((lVar25 < FVar13) && ((&pAVar18->dir)[lVar14] == cVar3)) {
                pAVar31->edge_next = *(AF_Segment *)((long)&pAVar18->first + lVar14);
                *(AF_Segment_conflict *)(*(long *)((long)&pAVar18->last + lVar14) + 0x18) = pAVar31;
                *(AF_Segment_conflict *)((long)&pAVar18->last + lVar14) = pAVar31;
                goto LAB_0026a969;
              }
              lVar14 = lVar14 + 0x58;
            } while (uVar17 * 0x58 - lVar14 != 0);
          }
          FVar10 = af_axis_hints_new_edge
                             (hints->axis + uVar19,(int)sVar9,(int)cVar3,top_to_bottom_hinting,
                              memory,&local_38);
          if (FVar10 != 0) {
            return FVar10;
          }
          local_38->link = (AF_Edge)0x0;
          local_38->serif = (AF_Edge)0x0;
          local_38->scale = 0;
          local_38->blue_edge = (AF_Width)0x0;
          local_38->pos = 0;
          local_38->flags = '\0';
          local_38->dir = '\0';
          *(undefined6 *)&local_38->field_0x1a = 0;
          *(undefined8 *)local_38 = 0;
          local_38->opos = 0;
          *(undefined8 *)&local_38->score = 0;
          local_38->first = pAVar31;
          local_38->last = pAVar31;
          local_38->dir = pAVar31->dir;
          sVar9 = pAVar31->pos;
          local_38->fpos = sVar9;
          lVar14 = (long)sVar9 * (long)(int)b_;
          lVar14 = lVar14 + (lVar14 >> 0x3f) + 0x8000 >> 0x10;
          local_38->opos = lVar14;
          local_38->pos = lVar14;
          pAVar31->edge_next = pAVar31;
        }
      }
LAB_0026a969:
      pAVar31 = pAVar31 + 1;
    } while (pAVar31 < pAVar30);
    do {
      if ((pAVar22->dir == '\x04') && (uVar17 = (ulong)hints->axis[uVar19].num_edges, uVar17 != 0))
      {
        pAVar18 = hints->axis[uVar19].edges;
        lVar12 = 0;
        do {
          lVar25 = (long)pAVar22->pos - (long)*(short *)((long)&pAVar18->fpos + lVar12);
          lVar14 = -lVar25;
          if (0 < lVar25) {
            lVar14 = lVar25;
          }
          if (lVar14 < FVar13) {
            pAVar22->edge_next = *(AF_Segment *)((long)&pAVar18->first + lVar12);
            *(AF_Segment_conflict *)(*(long *)((long)&pAVar18->last + lVar12) + 0x18) = pAVar22;
            *(AF_Segment_conflict *)((long)&pAVar18->last + lVar12) = pAVar22;
            break;
          }
          lVar12 = lVar12 + 0x58;
        } while (uVar17 * 0x58 - lVar12 != 0);
      }
      pAVar22 = pAVar22 + 1;
    } while (pAVar22 < pAVar30);
  }
  pAVar18 = hints->axis[uVar19].edges;
  if ((pAVar18 != (AF_Edge_conflict)0x0) &&
     (uVar19 = (ulong)hints->axis[uVar19].num_edges, uVar19 != 0)) {
    pAVar15 = pAVar18 + uVar19;
    pAVar20 = pAVar18;
    do {
      pAVar7 = pAVar20->first;
      pAVar23 = pAVar7;
      if (pAVar7 != (AF_Segment)0x0) {
        do {
          pAVar23->edge = pAVar20;
          ppAVar32 = &pAVar23->edge_next;
          pAVar23 = *ppAVar32;
        } while (*ppAVar32 != pAVar7);
      }
      pAVar20 = pAVar20 + 1;
    } while (pAVar20 < pAVar15);
    do {
      pAVar7 = pAVar18->first;
      ppAVar1 = &pAVar18->link;
      ppAVar2 = &pAVar18->serif;
      iVar24 = 0;
      iVar26 = 0;
      pAVar23 = pAVar7;
      do {
        if ((pAVar23->serif == (AF_Segment)0x0) ||
           (pAVar20 = pAVar23->serif->edge, pAVar20 == (AF_Edge_conflict)0x0)) {
          bVar33 = false;
        }
        else {
          bVar33 = pAVar20 != pAVar18;
        }
        bVar4 = pAVar23->flags;
        if (pAVar23->link == (AF_Segment)0x0) {
          if (bVar33) goto LAB_0026aa7b;
        }
        else if ((bVar33) || (pAVar23->link->edge != (AF_Edge_conflict)0x0)) {
LAB_0026aa7b:
          ppAVar32 = &pAVar23->serif;
          ppAVar8 = ppAVar2;
          if (!bVar33) {
            ppAVar32 = &pAVar23->link;
            ppAVar8 = ppAVar1;
          }
          pAVar20 = *ppAVar8;
          if (pAVar20 == (AF_Edge_conflict)0x0) {
LAB_0026aad2:
            pAVar20 = (*ppAVar32)->edge;
          }
          else {
            uVar28 = (int)pAVar18->fpos - (int)pAVar20->fpos;
            uVar21 = -uVar28;
            if (0 < (int)uVar28) {
              uVar21 = uVar28;
            }
            uVar29 = (int)pAVar23->pos - (int)(*ppAVar32)->pos;
            uVar28 = -uVar29;
            if (0 < (int)uVar29) {
              uVar28 = uVar29;
            }
            if ((uVar28 & 0xffff) < (uVar21 & 0xffff)) goto LAB_0026aad2;
          }
          if (bVar33) {
            *ppAVar2 = pAVar20;
            pAVar20->flags = pAVar20->flags | 2;
          }
          else {
            *ppAVar1 = pAVar20;
          }
        }
        uVar21 = bVar4 & 1;
        iVar24 = iVar24 + uVar21;
        iVar26 = iVar26 + (uint)(byte)((byte)uVar21 ^ 1);
        pAVar23 = pAVar23->edge_next;
      } while (pAVar23 != pAVar7);
      pAVar18->flags = iVar26 <= iVar24 && 0 < iVar24;
      if ((pAVar18->serif != (AF_Edge)0x0) && (*ppAVar1 != (AF_Edge)0x0)) {
        *ppAVar2 = (AF_Edge)0x0;
      }
      pAVar18 = pAVar18 + 1;
    } while (pAVar18 < pAVar15);
  }
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_latin_hints_detect_features( AF_GlyphHints  hints,
                                  FT_UInt        width_count,
                                  AF_WidthRec*   widths,
                                  AF_Dimension   dim )
  {
    FT_Error  error;


    error = af_latin_hints_compute_segments( hints, dim );
    if ( !error )
    {
      af_latin_hints_link_segments( hints, width_count, widths, dim );

      error = af_latin_hints_compute_edges( hints, dim );
    }

    return error;
  }